

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MeanSquaredErrorLossLayer::SerializeWithCachedSizes
          (MeanSquaredErrorLossLayer *this,CodedOutputStream *output)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  string *psVar4;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  MeanSquaredErrorLossLayer *this_local;
  
  input_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    input_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    input_abi_cxx11_(this);
    iVar1 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar3,iVar1,SERIALIZE,"CoreML.Specification.MeanSquaredErrorLossLayer.input");
    psVar4 = input_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,psVar4,output);
  }
  target_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    target_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    target_abi_cxx11_(this);
    iVar1 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar3,iVar1,SERIALIZE,"CoreML.Specification.MeanSquaredErrorLossLayer.target");
    psVar4 = target_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(2,psVar4,output);
  }
  return;
}

Assistant:

void MeanSquaredErrorLossLayer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MeanSquaredErrorLossLayer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string input = 1;
  if (this->input().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->input().data(), this->input().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MeanSquaredErrorLossLayer.input");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->input(), output);
  }

  // string target = 2;
  if (this->target().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->target().data(), this->target().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MeanSquaredErrorLossLayer.target");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->target(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MeanSquaredErrorLossLayer)
}